

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::SetProperty(cmTarget *this,string *prop,char *value)

{
  cmMakefile *pcVar1;
  cmTargetInternals *pcVar2;
  pointer ppTVar3;
  cmGeneratorExpression cVar4;
  bool bVar5;
  ostream *poVar6;
  auto_ptr<cmCompiledGeneratorExpression> *this_00;
  ostringstream *this_01;
  cmCompiledGeneratorExpression *x;
  cmGeneratorExpression local_210;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_1b8;
  auto_ptr<cmCompiledGeneratorExpression> local_1b0;
  auto_ptr<cmCompiledGeneratorExpression> local_1a8;
  auto_ptr<cmCompiledGeneratorExpression> local_1a0;
  auto_ptr<cmCompiledGeneratorExpression> local_198;
  ostringstream e;
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) &&
     (bVar5 = whiteListedInterfaceProperty(prop), !bVar5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar6 = std::operator<<(poVar6,(string *)prop);
    std::operator<<(poVar6,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
LAB_0035f626:
    std::__cxx11::string::~string((string *)&ge);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return;
  }
  bVar5 = std::operator==(prop,"NAME");
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,"NAME property is read-only\n");
    pcVar1 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
    goto LAB_0035f626;
  }
  bVar5 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar5) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
    deleteAndClear(&((this->Internal).Pointer)->IncludeDirectoriesEntries);
    cmGeneratorExpression::Parse(&local_210,(char *)&ge);
    cVar4.Backtrace = local_210.Backtrace;
    local_210.Backtrace = (cmListFileBacktrace *)0x0;
    cge.x_ = (cmCompiledGeneratorExpression *)cVar4.Backtrace;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
    pcVar2 = (this->Internal).Pointer;
    local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    cge.x_ = (cmCompiledGeneratorExpression *)0x0;
    local_198.x_ = (cmCompiledGeneratorExpression *)0x0;
    (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)cVar4.Backtrace;
    (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
    ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
              ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                *)&pcVar2->IncludeDirectoriesEntries,(TargetPropertyEntry **)&local_210);
    this_00 = &local_198;
  }
  else {
    bVar5 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar5) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
      deleteAndClear(&((this->Internal).Pointer)->CompileOptionsEntries);
      cmGeneratorExpression::Parse(&local_210,(char *)&ge);
      cVar4.Backtrace = local_210.Backtrace;
      local_210.Backtrace = (cmListFileBacktrace *)0x0;
      cge.x_ = (cmCompiledGeneratorExpression *)cVar4.Backtrace;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
      pcVar2 = (this->Internal).Pointer;
      local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
      cge.x_ = (cmCompiledGeneratorExpression *)0x0;
      local_1a0.x_ = (cmCompiledGeneratorExpression *)0x0;
      (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)cVar4.Backtrace;
      (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
      super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
      super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar2->CompileOptionsEntries,(TargetPropertyEntry **)&local_210);
      this_00 = &local_1a0;
    }
    else {
      bVar5 = std::operator==(prop,"COMPILE_FEATURES");
      if (bVar5) {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
        cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
        deleteAndClear(&((this->Internal).Pointer)->CompileFeaturesEntries);
        cmGeneratorExpression::Parse(&local_210,(char *)&ge);
        cVar4.Backtrace = local_210.Backtrace;
        local_210.Backtrace = (cmListFileBacktrace *)0x0;
        cge.x_ = (cmCompiledGeneratorExpression *)cVar4.Backtrace;
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
        pcVar2 = (this->Internal).Pointer;
        local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
        cge.x_ = (cmCompiledGeneratorExpression *)0x0;
        local_1a8.x_ = (cmCompiledGeneratorExpression *)0x0;
        (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)cVar4.Backtrace;
        (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
        super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
        super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar2->CompileFeaturesEntries,(TargetPropertyEntry **)&local_210);
        this_00 = &local_1a8;
      }
      else {
        bVar5 = std::operator==(prop,"COMPILE_DEFINITIONS");
        if (bVar5) {
          cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
          deleteAndClear(&((this->Internal).Pointer)->CompileDefinitionsEntries);
          cmGeneratorExpression::Parse(&local_210,(char *)&ge);
          cVar4.Backtrace = local_210.Backtrace;
          local_210.Backtrace = (cmListFileBacktrace *)0x0;
          cge.x_ = (cmCompiledGeneratorExpression *)cVar4.Backtrace;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
          pcVar2 = (this->Internal).Pointer;
          local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
          cge.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_1b0.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cVar4.Backtrace;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
          std::
          vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
          ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                    ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                      *)&pcVar2->CompileDefinitionsEntries,(TargetPropertyEntry **)&local_210);
          this_00 = &local_1b0;
        }
        else {
          bVar5 = std::operator==(prop,"EXPORT_NAME");
          if ((bVar5) && (this->IsImportedTarget == true)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar6 = std::operator<<((ostream *)&e,
                                     "EXPORT_NAME property can\'t be set on imported targets (\"");
            poVar6 = std::operator<<(poVar6,(string *)&this->Name);
            std::operator<<(poVar6,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
            goto LAB_0035f626;
          }
          bVar5 = std::operator==(prop,"LINK_LIBRARIES");
          if (bVar5) {
            std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::clear
                      (&((this->Internal).Pointer)->LinkImplementationPropertyEntries);
            cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
            std::__cxx11::string::string((string *)&cge,value,(allocator *)&local_210);
            cmValueWithOrigin::cmValueWithOrigin
                      ((cmValueWithOrigin *)&e,(string *)&cge,(cmListFileBacktrace *)&ge);
            std::__cxx11::string::~string((string *)&cge);
            std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                      (&((this->Internal).Pointer)->LinkImplementationPropertyEntries,
                       (value_type *)&e);
            cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)&e);
            this_01 = (ostringstream *)&ge;
            goto LAB_0035f898;
          }
          bVar5 = std::operator==(prop,"SOURCES");
          if (!bVar5) {
            cmPropertyMap::SetProperty(&this->Properties,prop,value);
            MaybeInvalidatePropertyCache(this,prop);
            return;
          }
          if (this->IsImportedTarget == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar6 = std::operator<<((ostream *)&e,
                                     "SOURCES property can\'t be set on imported targets (\"");
            poVar6 = std::operator<<(poVar6,(string *)&this->Name);
            std::operator<<(poVar6,"\")\n");
            pcVar1 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&ge);
            goto LAB_0035f626;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
          ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
          cmMakefile::GetBacktrace((cmListFileBacktrace *)&e,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&e);
          pcVar2 = (this->Internal).Pointer;
          ppTVar3 = (pcVar2->SourceEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pcVar2->SourceEntries).
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
            (pcVar2->SourceEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppTVar3;
          }
          cmGeneratorExpression::Parse(&local_210,(char *)&ge);
          cVar4.Backtrace = local_210.Backtrace;
          local_210.Backtrace = (cmListFileBacktrace *)0x0;
          cge.x_ = (cmCompiledGeneratorExpression *)cVar4.Backtrace;
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_210);
          pcVar2 = (this->Internal).Pointer;
          local_210.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
          cge.x_ = (cmCompiledGeneratorExpression *)0x0;
          local_1b8.x_ = (cmCompiledGeneratorExpression *)0x0;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cVar4.Backtrace;
          (((cmCompiledGeneratorExpression *)local_210.Backtrace)->Backtrace).
          super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
          super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
          std::
          vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
          ::emplace_back<cmTargetInternals::TargetPropertyEntry*>
                    ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                      *)&pcVar2->SourceEntries,(TargetPropertyEntry **)&local_210);
          this_00 = &local_1b8;
        }
      }
    }
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(this_00);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  this_01 = &e;
LAB_0035f898:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)this_01);
  return;
}

Assistant:

void cmTarget::SetProperty(const std::string& prop, const char* value)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->IncludeDirectoriesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->IncludeDirectoriesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileOptionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileOptionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileFeaturesEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileFeaturesEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    deleteAndClear(this->Internal->CompileDefinitionsEntries);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->CompileDefinitionsEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    this->Internal->LinkImplementationPropertyEntries.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    this->Internal->SourceFilesMap.clear();
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->SourceEntries.clear();
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
    this->Internal->SourceEntries.push_back(
                          new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.SetProperty(prop, value);
    this->MaybeInvalidatePropertyCache(prop);
    }
}